

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

char * memdup(char *src,size_t buffer_length)

{
  char *pcVar1;
  char *buffer;
  size_t sStack_28;
  _Bool add;
  size_t length;
  size_t buffer_length_local;
  char *src_local;
  
  buffer._7_1_ = 0;
  sStack_28 = buffer_length;
  if (buffer_length == 0) {
    if (src == (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)("");
      return pcVar1;
    }
    sStack_28 = strlen(src);
    buffer._7_1_ = 1;
  }
  src_local = (char *)(*Curl_cmalloc)(sStack_28 + buffer._7_1_);
  if (src_local == (char *)0x0) {
    src_local = (char *)0x0;
  }
  else {
    memcpy(src_local,src,sStack_28);
    if (buffer._7_1_ != 0) {
      src_local[sStack_28] = '\0';
    }
  }
  return src_local;
}

Assistant:

static char *memdup(const char *src, size_t buffer_length)
{
  size_t length;
  bool add = FALSE;
  char *buffer;

  if(buffer_length)
    length = buffer_length;
  else if(src) {
    length = strlen(src);
    add = TRUE;
  }
  else
    /* no length and a NULL src pointer! */
    return strdup("");

  buffer = malloc(length+add);
  if(!buffer)
    return NULL; /* fail */

  memcpy(buffer, src, length);

  /* if length unknown do null termination */
  if(add)
    buffer[length] = '\0';

  return buffer;
}